

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  VectorExtensionType VVar1;
  uint64_t uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  ushort uVar12;
  DisassemblerMode DVar13;
  uint uVar14;
  long lVar15;
  ushort uVar16;
  short sVar18;
  uint uVar19;
  uint64_t uVar20;
  ulong uVar21;
  byte bVar22;
  uint8_t uVar23;
  reader_info *prVar24;
  bool bVar25;
  uint8_t byte;
  uint8_t byte1;
  uint8_t nextByte;
  uint8_t byte2;
  ushort local_48;
  byte local_45;
  ushort local_44;
  byte local_41;
  ulong local_40;
  ulong local_38;
  ushort uVar17;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  local_48 = local_48 & 0xff00;
  insn->necessaryPrefixLocation = startLoc - 1;
  local_40 = 0;
  local_38 = 0;
  do {
    if (mode == MODE_64BIT) {
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,insn->readerCursor
                             );
      if (iVar4 != 0) {
        return -1;
      }
      uVar6 = insn->readerCursor;
      uVar20 = uVar6 + 1;
      insn->readerCursor = uVar20;
      if (((byte)local_48 & 0xf0) == 0x40) {
        prVar24 = (reader_info *)insn->readerArg;
        while( true ) {
          iVar4 = (*insn->reader)(prVar24,(uint8_t *)&local_48,uVar20);
          if (iVar4 != 0) {
            return -1;
          }
          if (((byte)local_48 & 0xf0) != 0x40) break;
          iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,
                                  insn->readerCursor);
          if (iVar4 != 0) {
            return -1;
          }
          prVar24 = (reader_info *)insn->readerArg;
          uVar20 = insn->readerCursor + 1;
          insn->readerCursor = uVar20;
        }
        if (((((byte)local_48 - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)((byte)local_48 - 0x2e) & 0x3f) & 1) != 0)) ||
            (((byte)local_48 - 0xf0 < 4 && ((byte)local_48 - 0xf0 != 1)))) ||
           ((byte)local_48 == 0x26)) goto LAB_00228183;
        uVar6 = insn->readerCursor - 1;
      }
      insn->readerCursor = uVar6;
    }
LAB_00228183:
    uVar20 = insn->readerCursor;
    iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,uVar20);
    if (iVar4 != 0) {
      return -1;
    }
    uVar2 = insn->readerCursor;
    uVar6 = uVar2 + 1;
    insn->readerCursor = uVar6;
    if (((byte)local_48 & 0xfe) == 0xf2 && uVar2 == insn->startLocation) {
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_44,uVar6);
      if (iVar4 != 0) {
        return -1;
      }
      if (((((byte)local_44 & 0xfffffff8) == 0x90) || ((byte)local_44 == 0xf0)) ||
         (((byte)local_44 & 0xfe) == 0x86)) {
        insn->xAcquireRelease = true;
      }
      if ((((byte)local_48 == 0xf3) && (uVar19 = (byte)local_44 - 0x88, uVar19 < 0x40)) &&
         ((0xc000000000000003U >> ((ulong)uVar19 & 0x3f) & 1) != 0)) {
        insn->xAcquireRelease = true;
      }
      if ((((byte)local_44 & 0xf0) == 0x40) && (insn->mode == MODE_64BIT)) {
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_44,
                                insn->readerCursor);
        if (iVar4 != 0) {
          return -1;
        }
        uVar6 = insn->readerCursor + 1;
        insn->readerCursor = uVar6;
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_44,uVar6);
        if (iVar4 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    if ((byte)local_48 < 0x3e) {
      if ((byte)local_48 == 0x26) {
        insn->segmentOverride = SEG_OVERRIDE_ES;
        insn->isPrefix65 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix64 = false;
        insn->isPrefix26 = true;
        insn->prefix26 = uVar20;
        insn->prefix1 = '&';
      }
      else if ((byte)local_48 == 0x2e) {
        insn->segmentOverride = SEG_OVERRIDE_CS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix2e = true;
        insn->prefix2e = uVar20;
        insn->prefix1 = '.';
      }
      else {
        if ((byte)local_48 != 0x36) break;
        insn->segmentOverride = SEG_OVERRIDE_SS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix36 = true;
        insn->prefix36 = uVar20;
        insn->prefix1 = '6';
      }
    }
    else {
      if ((byte)local_48 - 100 < 4) {
        iVar4 = (*(code *)(&DAT_003d7c80 +
                          *(int *)(&DAT_003d7c80 + (ulong)((byte)local_48 - 100) * 4)))();
        return iVar4;
      }
      if (((byte)local_48 - 0xf0 < 4) && ((byte)local_48 - 0xf0 != 1)) {
        insn->isPrefixf3 = false;
        insn->isPrefixf0 = false;
        insn->isPrefixf2 = false;
        if ((byte)local_48 == 0xf3) {
          insn->isPrefixf3 = true;
          lVar15 = 0x60;
LAB_0022845e:
          *(uint64_t *)(&insn->operandSize + lVar15) = uVar20;
        }
        else {
          if ((byte)local_48 == 0xf2) {
            insn->isPrefixf2 = true;
            lVar15 = 0x58;
            goto LAB_0022845e;
          }
          if ((byte)local_48 == 0xf0) {
            insn->isPrefixf0 = true;
            lVar15 = 0x50;
            goto LAB_0022845e;
          }
        }
        insn->prefix0 = (byte)local_48;
      }
      else {
        if ((byte)local_48 != 0x3e) break;
        insn->segmentOverride = SEG_OVERRIDE_DS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix3e = true;
        insn->prefix3e = uVar20;
        insn->prefix1 = '>';
      }
    }
    mode = insn->mode;
  } while( true );
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  if ((byte)local_48 < 0xc4) {
    if ((byte)local_48 == 0x62) {
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,insn->readerCursor);
      if (iVar4 != 0) {
        return -1;
      }
      uVar20 = insn->readerCursor;
      uVar6 = uVar20 + 1;
      insn->readerCursor = uVar6;
      if ((local_45 & 0xc) == 0 && (0xbf < local_45 || insn->mode == MODE_64BIT)) {
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_41,uVar6);
        if (iVar4 != 0) {
          return -1;
        }
        if ((local_41 & 4) == 0) {
          uVar6 = insn->readerCursor;
          uVar20 = uVar6 - 2;
          insn->readerCursor = uVar20;
          insn->necessaryPrefixLocation = uVar6 - 4;
          uVar8 = local_40;
          uVar7 = local_40;
          if (insn->vectorExtensionType != TYPE_EVEX) goto LAB_00228719;
        }
        else {
          insn->vectorExtensionType = TYPE_EVEX;
          uVar20 = insn->readerCursor;
        }
        insn->vectorExtensionPrefix[0] = (byte)local_48;
        insn->vectorExtensionPrefix[1] = local_45;
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                                uVar20);
        if (iVar4 != 0) {
          return -1;
        }
        uVar20 = insn->readerCursor + 1;
        insn->readerCursor = uVar20;
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 3,
                                uVar20);
        if (iVar4 != 0) {
          return -1;
        }
        uVar20 = insn->readerCursor + 1;
        insn->readerCursor = uVar20;
        bVar9 = insn->vectorExtensionPrefix[2];
        if (insn->mode == MODE_64BIT) {
          insn->rexPrefix = (byte)~insn->vectorExtensionPrefix[1] >> 5 | bVar9 >> 4 & 8 | 0x40;
        }
        uVar8 = 1;
        uVar7 = uVar8;
        if ((bVar9 & 3) != 1) {
          uVar8 = local_40 & 0xff;
          uVar7 = uVar8;
        }
      }
      else {
        uVar20 = uVar20 - 1;
        insn->readerCursor = uVar20;
        uVar8 = local_40;
        uVar7 = local_40;
      }
    }
    else if ((byte)local_48 == 0x8f) {
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,insn->readerCursor);
      if (iVar4 != 0) {
        return -1;
      }
      if ((local_45 & 0x38) != 0) {
        insn->vectorExtensionType = TYPE_XOP;
        goto LAB_002289e8;
      }
      uVar6 = insn->readerCursor;
      uVar20 = uVar6 - 1;
      insn->readerCursor = uVar20;
      insn->necessaryPrefixLocation = uVar6 - 2;
      uVar8 = local_40;
      uVar7 = local_40;
      if (insn->vectorExtensionType == TYPE_XOP) goto LAB_002289fa;
    }
    else {
LAB_00228543:
      if ((insn->mode == MODE_64BIT) && (((byte)local_48 & 0xf0) == 0x40)) {
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,insn->readerCursor);
        if (iVar4 != 0) {
          return -1;
        }
        while ((local_45 & 0xf0) == 0x40) {
          iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,
                                  insn->readerCursor);
          if (iVar4 != 0) {
            return -1;
          }
          uVar20 = insn->readerCursor + 1;
          insn->readerCursor = uVar20;
          iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,uVar20);
          if (iVar4 != 0) {
            return -1;
          }
        }
        insn->rexPrefix = (byte)local_48;
        uVar20 = insn->readerCursor;
        uVar6 = uVar20;
      }
      else {
        uVar6 = insn->readerCursor;
        uVar20 = uVar6 - 1;
        insn->readerCursor = uVar20;
      }
      insn->necessaryPrefixLocation = uVar6 - 2;
      uVar8 = local_40;
      uVar7 = local_40;
    }
  }
  else {
    if ((byte)local_48 == 0xc4) {
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,insn->readerCursor);
      if (iVar4 != 0) {
        return -1;
      }
      if ((insn->mode == MODE_64BIT) || (0xbf < local_45)) {
        insn->vectorExtensionType = TYPE_VEX_3B;
LAB_002289e8:
        uVar20 = insn->readerCursor;
        insn->necessaryPrefixLocation = uVar20 - 1;
      }
      else {
        uVar6 = insn->readerCursor;
        uVar20 = uVar6 - 1;
        insn->readerCursor = uVar20;
        insn->necessaryPrefixLocation = uVar6 - 2;
        uVar8 = local_40;
        uVar7 = local_40;
        if (insn->vectorExtensionType != TYPE_VEX_3B) goto LAB_00228719;
      }
LAB_002289fa:
      insn->vectorExtensionPrefix[0] = (byte)local_48;
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar20)
      ;
      if (iVar4 != 0) {
        return -1;
      }
      uVar20 = insn->readerCursor + 1;
      insn->readerCursor = uVar20;
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,uVar20)
      ;
      if (iVar4 != 0) {
        return -1;
      }
      uVar20 = insn->readerCursor + 1;
      insn->readerCursor = uVar20;
      bVar9 = insn->vectorExtensionPrefix[2];
      if (insn->mode == MODE_64BIT) {
        insn->rexPrefix = (byte)~insn->vectorExtensionPrefix[1] >> 5 | bVar9 >> 4 & 8 | 0x40;
      }
    }
    else {
      if ((byte)local_48 != 0xc5) goto LAB_00228543;
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,insn->readerCursor);
      if (iVar4 != 0) {
        return -1;
      }
      if ((insn->mode == MODE_64BIT) || (0xbf < local_45)) {
        insn->vectorExtensionType = TYPE_VEX_2B;
        uVar20 = insn->readerCursor;
      }
      else {
        uVar20 = insn->readerCursor - 1;
        insn->readerCursor = uVar20;
        uVar8 = local_40;
        uVar7 = local_40;
        if (insn->vectorExtensionType != TYPE_VEX_2B) goto LAB_00228719;
      }
      insn->vectorExtensionPrefix[0] = (byte)local_48;
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar20)
      ;
      if (iVar4 != 0) {
        return -1;
      }
      uVar20 = insn->readerCursor + 1;
      insn->readerCursor = uVar20;
      bVar9 = insn->vectorExtensionPrefix[1];
      if (insn->mode == MODE_64BIT) {
        insn->rexPrefix = (byte)~bVar9 >> 5 & 4 | 0x40;
      }
    }
    uVar8 = 1;
    uVar7 = local_40;
    if ((bVar9 & 3) != 1) {
      uVar8 = local_40 & 0xff;
    }
  }
LAB_00228719:
  local_40 = uVar7;
  DVar13 = insn->mode;
  bVar22 = (byte)uVar8;
  bVar9 = (byte)local_38;
  if (DVar13 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar11 = (~bVar9 & 1) * '\x04' + '\x04';
      uVar10 = '\x04';
      uVar23 = '\x04';
      goto LAB_0022876b;
    }
    uVar23 = (~bVar22 & 1) * '\x02' + '\x02';
    insn->registerSize = uVar23;
    insn->addressSize = (~bVar9 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar23;
    insn->immediateSize = uVar23;
    if (insn->rexPrefix == 0) {
      uVar23 = (~bVar22 & 1) * '\x04' + '\x04';
    }
LAB_0022877e:
    insn->immSize = uVar23;
  }
  else {
    if (DVar13 == MODE_32BIT) {
      uVar23 = (~bVar22 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar23;
      uVar8 = (ulong)(byte)~bVar9;
LAB_00228761:
      uVar10 = ((byte)uVar8 & 1) * '\x02' + '\x02';
      uVar11 = uVar10;
LAB_0022876b:
      insn->addressSize = uVar11;
      insn->displacementSize = uVar10;
      insn->immediateSize = uVar23;
      goto LAB_0022877e;
    }
    if (DVar13 == MODE_16BIT) {
      uVar23 = (bVar22 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar23;
      uVar8 = local_38;
      goto LAB_00228761;
    }
  }
  insn->opcodeType = ONEBYTE;
  insn->firstByte = '\0';
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_002287b5_caseD_1:
    insn->twoByteEscape = '\x0f';
switchD_00228841_caseD_1:
    insn->opcodeType = TWOBYTE;
    break;
  case TYPE_VEX_3B:
    bVar9 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar9 != 3) {
      if (bVar9 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_00228841_caseD_2;
      }
      if (bVar9 != 1) {
        return -1;
      }
      goto switchD_002287b5_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_00228841_caseD_3:
    insn->opcodeType = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    switch(insn->vectorExtensionPrefix[1] & 3) {
    case 0:
      return -1;
    case 1:
      goto switchD_00228841_caseD_1;
    case 2:
switchD_00228841_caseD_2:
      insn->opcodeType = THREEBYTE_38;
      break;
    case 3:
      goto switchD_00228841_caseD_3;
    }
    break;
  case TYPE_XOP:
    bVar9 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar9 == 10) {
      insn->opcodeType = XOPA_MAP;
    }
    else if (bVar9 == 9) {
      insn->opcodeType = XOP9_MAP;
    }
    else {
      if (bVar9 != 8) {
        return -1;
      }
      insn->opcodeType = XOP8_MAP;
    }
    break;
  default:
    iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,uVar20);
    if (iVar4 != 0) {
      return -1;
    }
    uVar20 = insn->readerCursor + 1;
    insn->readerCursor = uVar20;
    insn->firstByte = (byte)local_48;
    if ((byte)local_48 == '\x0f') {
      insn->twoByteEscape = '\x0f';
      iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,uVar20);
      if (iVar4 != 0) {
        return -1;
      }
      uVar20 = insn->readerCursor + 1;
      insn->readerCursor = uVar20;
      if ((byte)local_48 < 0x38) {
        if ((byte)local_48 == 0xe) {
          insn->opcodeType = T3DNOW_MAP;
          insn->consumedModRM = true;
        }
        else {
          if ((byte)local_48 != 0xf) goto LAB_002292de;
          iVar4 = readModRM(insn);
          if (iVar4 != 0) {
            return -1;
          }
          iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,
                                  insn->readerCursor);
          if (iVar4 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor + 1;
          insn->opcodeType = T3DNOW_MAP;
        }
      }
      else if ((byte)local_48 == 0x3a) {
        insn->threeByteEscape = ':';
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,uVar20);
        if (iVar4 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_3A;
      }
      else if ((byte)local_48 == 0x38) {
        insn->threeByteEscape = '8';
        iVar4 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_48,uVar20);
        if (iVar4 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_38;
      }
      else {
LAB_002292de:
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = (byte)local_48;
    goto LAB_00228b62;
  }
  iVar4 = (*insn->reader)((reader_info *)insn->readerArg,&insn->opcode,uVar20);
  if (iVar4 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
LAB_00228b62:
  DVar13 = insn->mode;
  VVar1 = insn->vectorExtensionType;
  bVar25 = DVar13 == MODE_64BIT;
  if (VVar1 == TYPE_NO_VEX_XOP) {
    if (DVar13 == MODE_16BIT) {
      uVar20 = insn->necessaryPrefixLocation;
LAB_00228c19:
      if ((insn->isPrefix67 == true) && (insn->prefix67 == uVar20)) {
        uVar12 = bVar25 | 0x20;
        goto LAB_00228e0f;
      }
      if (DVar13 != MODE_16BIT) {
        if ((insn->isPrefixf3 == true) && (insn->prefixf3 == uVar20)) {
          uVar12 = bVar25 | 2;
        }
        else {
          uVar12 = (ushort)bVar25;
          if ((insn->isPrefixf2 == true) && (insn->prefixf2 == uVar20)) {
            uVar12 = bVar25 | 4;
          }
        }
        goto LAB_00228c5d;
      }
      uVar12 = insn->rexPrefix & 8;
      goto LAB_00228e21;
    }
    uVar20 = insn->necessaryPrefixLocation;
    if ((insn->isPrefix66 != true) || (insn->prefix66 != uVar20)) goto LAB_00228c19;
    uVar12 = bVar25 | 0x10;
LAB_00228c5d:
    uVar17 = uVar12 | insn->rexPrefix & 8;
  }
  else {
    uVar12 = 0x40;
    if (VVar1 == TYPE_EVEX) {
      uVar12 = 0x100;
    }
    uVar12 = bVar25 | uVar12;
    if (VVar1 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar12 = uVar12 | 0x10;
        break;
      case 2:
        uVar12 = uVar12 | 2;
        break;
      case 3:
        uVar12 = uVar12 | 4;
      }
      bVar9 = insn->vectorExtensionPrefix[3];
      if ((char)bVar9 < '\0') {
        uVar12 = uVar12 + 0x1000;
      }
      sVar18 = (bVar9 & 0x10) * 0x200;
      sVar3 = sVar18 + 0x800;
      if ((bVar9 & 7) == 0) {
        sVar3 = sVar18;
      }
      uVar12 = (bVar9 & 0x60) << 4 | sVar3 + uVar12;
    }
    else {
      if (VVar1 == TYPE_VEX_2B) {
        bVar9 = insn->vectorExtensionPrefix[1];
        uVar17 = (ushort)bVar9;
        uVar16 = (ushort)bVar9;
        switch(bVar9 & 3) {
        case 1:
          goto switchD_00228c10_caseD_1;
        case 2:
          goto switchD_00228c10_caseD_2;
        case 3:
          goto switchD_00228c10_caseD_3;
        }
      }
      else if (VVar1 == TYPE_XOP) {
        bVar9 = insn->vectorExtensionPrefix[2];
        uVar17 = (ushort)bVar9;
        uVar16 = (ushort)bVar9;
        switch(bVar9 & 3) {
        case 1:
          goto switchD_00228c10_caseD_1;
        case 2:
          goto switchD_00228c10_caseD_2;
        case 3:
          goto switchD_00228c10_caseD_3;
        }
      }
      else {
        if (VVar1 != TYPE_VEX_3B) {
          return -1;
        }
        bVar9 = insn->vectorExtensionPrefix[2];
        uVar17 = (ushort)bVar9;
        uVar16 = (ushort)bVar9;
        switch(bVar9 & 3) {
        case 1:
switchD_00228c10_caseD_1:
          uVar16 = uVar17;
          uVar12 = uVar12 | 0x10;
          break;
        case 2:
switchD_00228c10_caseD_2:
          uVar16 = uVar17;
          uVar12 = uVar12 | 2;
          break;
        case 3:
switchD_00228c10_caseD_3:
          uVar16 = uVar17;
          uVar12 = uVar12 | 4;
        }
      }
      uVar12 = uVar12 | (uVar16 & 4) << 5;
    }
LAB_00228e0f:
    uVar12 = uVar12 | insn->rexPrefix & 8;
    uVar17 = uVar12;
    if (DVar13 == MODE_16BIT) {
LAB_00228e21:
      uVar17 = uVar12;
      if ((insn->opcodeType == ONEBYTE) && (uVar17 = uVar12 ^ 0x20, insn->opcode != 0xe3)) {
        uVar17 = uVar12;
      }
    }
  }
  iVar4 = getIDWithAttrMask(&local_48,insn,uVar17);
  if (iVar4 != 0) {
    return -1;
  }
  if ((insn->mode == MODE_64BIT) ||
     ((((VVar1 = insn->vectorExtensionType, VVar1 != TYPE_VEX_3B && (VVar1 != TYPE_XOP)) &&
       (VVar1 != TYPE_EVEX)) || (-1 < (char)insn->vectorExtensionPrefix[2])))) {
LAB_00228e94:
    uVar12 = local_48;
    if (insn->opcodeType == ONEBYTE) {
      DVar13 = insn->mode;
      if ((insn->opcode & 0xfc) != 0xa0) goto LAB_00228ef6;
      uVar12 = uVar17 | 0x20;
      if (insn->isPrefix67 == false) {
        uVar12 = uVar17;
      }
      uVar17 = uVar12 | 0x10;
      if (insn->isPrefix66 == false) {
        uVar17 = uVar12;
      }
      uVar12 = uVar17 ^ 0x30;
      if (DVar13 != MODE_16BIT) {
        uVar12 = uVar17;
      }
      iVar4 = getIDWithAttrMask(&local_48,insn,uVar12);
      if (iVar4 != 0) {
        return -1;
      }
LAB_00228f6b:
      uVar8 = (ulong)local_48;
      insn->instructionID = local_48;
      local_44 = local_48;
      goto LAB_00229088;
    }
    DVar13 = insn->mode;
LAB_00228ef6:
    if (DVar13 == MODE_16BIT) {
      if ((uVar17 & 0x10) == 0) goto LAB_00228f06;
LAB_00228f54:
      if (((insn->opcodeType != ONEBYTE) || (insn->opcode != 0x90)) || ((insn->rexPrefix & 1) == 0))
      goto LAB_00228f6b;
      insn->opcode = 0x91;
      iVar4 = getIDWithAttrMask(&local_44,insn,uVar17);
      if (iVar4 == 0) {
        uVar12 = local_44;
      }
      local_44 = uVar12;
      insn->opcode = 0x90;
      insn->instructionID = local_44;
      insn->spec = x86DisassemblerInstrSpecifiers + local_44;
    }
    else {
      if (((uVar17 & 0x10) != 0) || (insn->isPrefix66 == false)) goto LAB_00228f54;
LAB_00228f06:
      uVar8 = (ulong)local_48;
      iVar4 = getIDWithAttrMask(&local_44,insn,uVar17 | 0x10);
      if ((iVar4 == 0) &&
         ((x86_16_bit_eq_lookup[uVar8] != 0 &&
          (uVar19 = x86_16_bit_eq_lookup[uVar8] - 1, uVar7 = (ulong)uVar19, uVar19 < 0x465)))) {
        uVar21 = (ulong)local_44;
        do {
          if (x86_16_bit_eq_tbl[uVar7].first != uVar12) break;
          if (x86_16_bit_eq_tbl[uVar7].second == local_44) {
            if (insn->isPrefix66 != (insn->mode == MODE_16BIT)) {
              insn->instructionID = local_44;
              goto LAB_00228f42;
            }
            break;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x465);
      }
      insn->instructionID = uVar12;
      uVar21 = uVar8;
      local_44 = uVar12;
LAB_00228f42:
      insn->spec = x86DisassemblerInstrSpecifiers + uVar21;
    }
  }
  else {
    iVar4 = getIDWithAttrMask(&local_44,insn,uVar17 | 8);
    if (iVar4 == 0) {
      uVar8 = (ulong)local_44;
      if (is_64bit_insn[uVar8] != false) goto LAB_00228e94;
      insn->instructionID = local_44;
    }
    else {
      insn->instructionID = local_48;
      uVar8 = (ulong)local_48;
      local_44 = local_48;
    }
LAB_00229088:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar8;
  }
  iVar4 = -1;
  if (local_44 == 0) {
    return -1;
  }
  if (insn->isPrefixf0 != true) {
    if ((insn->isPrefixf2 == true) && (insn->twoByteEscape == '\x0f')) {
      insn->prefix0 = '\0';
    }
    goto LAB_0022927b;
  }
  uVar19 = (uint)local_44;
  if (local_44 < 0x731) {
    if (uVar19 == 0x138 || local_44 < 0x138) {
      if (((local_44 - 0x23 < 0x37) &&
          ((0x700700381c0e07U >> ((ulong)(local_44 - 0x23) & 0x3f) & 1) != 0)) ||
         ((local_44 - 0xb1 < 0x1e && ((0x381c0e07U >> (local_44 - 0xb1 & 0x1f) & 1) != 0))))
      goto LAB_0022927b;
      uVar19 = uVar19 - 99;
      if (0xe < uVar19) {
        return -1;
      }
      uVar14 = 0x7007;
    }
    else {
      if (local_44 < 0x244) {
        if (0x21 < uVar19 - 0x139) {
          return -1;
        }
        if ((0x333333333U >> ((ulong)(uVar19 - 0x139) & 0x3f) & 1) == 0) {
          return -1;
        }
        goto LAB_0022927b;
      }
      if (((local_44 - 0x244 < 9) && ((0x1abU >> (local_44 - 0x244 & 0x1f) & 1) != 0)) ||
         ((local_44 - 0x297 < 9 && ((0x149U >> (local_44 - 0x297 & 0x1f) & 1) != 0))))
      goto LAB_0022927b;
      uVar19 = uVar19 - 0x396;
      if (8 < uVar19) {
        return -1;
      }
      uVar14 = 0x149;
    }
  }
  else if (uVar19 == 0xb11 || local_44 < 0xb11) {
    if (((local_44 - 0x731 < 0x3e) &&
        ((0x3c0e550004000055U >> ((ulong)(local_44 - 0x731) & 0x3f) & 1) != 0)) ||
       ((local_44 - 0xa0d < 0x1e && ((0x381c0e07U >> (local_44 - 0xa0d & 0x1f) & 1) != 0))))
    goto LAB_0022927b;
    uVar19 = uVar19 - 0x775;
    if (0xb < uVar19) {
      return -1;
    }
    uVar14 = 0xe07;
  }
  else {
    if ((local_44 - 0x2239 < 0x3f) &&
       ((0x70381c0e00291055U >> ((ulong)(local_44 - 0x2239) & 0x3f) & 1) != 0)) goto LAB_0022927b;
    uVar19 = uVar19 - 0xb12;
    if (0x1d < uVar19) {
      return -1;
    }
    uVar14 = 0x381c0e07;
  }
  if ((uVar14 >> (uVar19 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_0022927b:
  iVar5 = readOperands(insn);
  if ((iVar5 == 0) &&
     (uVar8 = insn->readerCursor - insn->startLocation, insn->length = uVar8, uVar8 < 0x10)) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}